

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_IF(Context *ctx)

{
  uint uVar1;
  size_t buflen;
  char src0 [64];
  char buf [64];
  char acStack_98 [64];
  char local_58 [64];
  
  if (ctx->profile_supports_nv2 != 0) {
    uVar1 = ctx->scratch_registers;
    buflen = (size_t)uVar1;
    ctx->scratch_registers = uVar1 + 1;
    if (ctx->max_scratch_registers <= (int)uVar1) {
      ctx->max_scratch_registers = uVar1 + 1;
    }
    snprintf(local_58,0x40,"scratch%d");
    get_ARB1_srcarg_varname(ctx,0,acStack_98,buflen);
    output_line(ctx,"MOVC %s.x, %s;",local_58,acStack_98);
    nv2_if(ctx);
    return;
  }
  failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
  return;
}

Assistant:

static void emit_ARB1_IF(Context *ctx)
{
    if (support_nv2(ctx))
    {
        char buf[64]; allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        char src0[64]; get_ARB1_srcarg_varname(ctx, 0, src0, sizeof (src0));
        output_line(ctx, "MOVC %s.x, %s;", buf, src0);
        nv2_if(ctx);
    } // if

    else  // stock ARB1 has no branching.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    } // else
}